

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

string * __thiscall wabt::Type::GetName_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  Type *local_18;
  Type *this_local;
  
  local_18 = this;
  this_local = (Type *)__return_storage_ptr__;
  switch(this->enum_) {
  case Any:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"any",&local_23);
    std::allocator<char>::~allocator(&local_23);
    break;
  case Void:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"void",&local_22);
    std::allocator<char>::~allocator(&local_22);
    break;
  default:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"<type_index[%d]>",(ulong)(uint)this->enum_);
    break;
  case Func:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"func",&local_21);
    std::allocator<char>::~allocator(&local_21);
    break;
  case Reference:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"(ref %d)",(ulong)this->type_index_);
    break;
  case ExternRef:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"externref",&local_24);
    std::allocator<char>::~allocator(&local_24);
    break;
  case FuncRef:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"funcref",&local_20);
    std::allocator<char>::~allocator(&local_20);
    break;
  case I16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"i16",&local_1f);
    std::allocator<char>::~allocator(&local_1f);
    break;
  case I8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"i8",&local_1e);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case V128:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"v128",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
    break;
  case F64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"f64",&local_1c);
    std::allocator<char>::~allocator(&local_1c);
    break;
  case F32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"f32",&local_1b);
    std::allocator<char>::~allocator(&local_1b);
    break;
  case I64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"i64",&local_1a);
    std::allocator<char>::~allocator(&local_1a);
    break;
  case I32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"i32",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const {
    switch (enum_) {
      case Type::I32:       return "i32";
      case Type::I64:       return "i64";
      case Type::F32:       return "f32";
      case Type::F64:       return "f64";
      case Type::V128:      return "v128";
      case Type::I8:        return "i8";
      case Type::I16:       return "i16";
      case Type::FuncRef:   return "funcref";
      case Type::Func:      return "func";
      case Type::Void:      return "void";
      case Type::Any:       return "any";
      case Type::ExternRef: return "externref";
      case Type::Reference:
        return StringPrintf("(ref %d)", type_index_);
      default:
        return StringPrintf("<type_index[%d]>", enum_);
    }
  }